

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O2

bool __thiscall QPDFMatrix::operator==(QPDFMatrix *this,QPDFMatrix *rhs)

{
  if ((((((this->a == rhs->a) && (!NAN(this->a) && !NAN(rhs->a))) && (this->b == rhs->b)) &&
       ((!NAN(this->b) && !NAN(rhs->b) && (this->c == rhs->c)))) &&
      ((!NAN(this->c) && !NAN(rhs->c) && ((this->d == rhs->d && (!NAN(this->d) && !NAN(rhs->d)))))))
     && ((this->e == rhs->e && (!NAN(this->e) && !NAN(rhs->e))))) {
    return (bool)(-(rhs->f == this->f) & 1);
  }
  return false;
}

Assistant:

bool
QPDFMatrix::operator==(QPDFMatrix const& rhs) const
{
    return (
        (this->a == rhs.a) && (this->b == rhs.b) && (this->c == rhs.c) && (this->d == rhs.d) &&
        (this->e == rhs.e) && (this->f == rhs.f));
}